

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Privkey * __thiscall
cfd::core::Privkey::operator-=(Privkey *__return_storage_ptr__,Privkey *this,Privkey *right)

{
  Privkey *in_stack_ffffffffffffff68;
  Privkey *this_00;
  Privkey local_60;
  undefined1 local_40 [8];
  Privkey key;
  Privkey *right_local;
  Privkey *this_local;
  
  this_00 = __return_storage_ptr__;
  key._24_8_ = right;
  CreateNegate(&local_60,right);
  CreateTweakAdd((Privkey *)local_40,this,&local_60);
  ~Privkey((Privkey *)0x45213a);
  operator=(this_00,in_stack_ffffffffffffff68);
  Privkey(this_00,in_stack_ffffffffffffff68);
  ~Privkey((Privkey *)0x452164);
  return __return_storage_ptr__;
}

Assistant:

Privkey Privkey::operator-=(const Privkey &right) {
  Privkey key = CreateTweakAdd(right.CreateNegate());
  *this = key;
  return *this;
}